

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing>::moveAppend
          (QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing> *this,Changing *b,Changing *e
          )

{
  qsizetype *pqVar1;
  Changing *pCVar2;
  undefined8 *puVar3;
  Changing *pCVar4;
  long lVar5;
  quintptr qVar6;
  undefined8 uVar7;
  PrivateShared *pPVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  
  if (b != e) {
    pCVar4 = (this->super_QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing>).ptr;
    for (; b < e; b = b + 1) {
      lVar5 = (this->super_QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing>).size;
      iVar10 = (b->parent).r;
      iVar11 = (b->parent).c;
      qVar6 = (b->parent).i;
      uVar7 = *(undefined8 *)((long)&(b->parent).m.ptr + 4);
      puVar3 = (undefined8 *)((long)&pCVar4[lVar5].parent.i + 4);
      *puVar3 = *(undefined8 *)((long)&(b->parent).i + 4);
      puVar3[1] = uVar7;
      pCVar2 = pCVar4 + lVar5;
      (pCVar2->parent).r = iVar10;
      (pCVar2->parent).c = iVar11;
      (pCVar2->parent).i = qVar6;
      pPVar8 = (b->last).d.data.shared;
      uVar7 = *(undefined8 *)((long)&(b->last).d.data + 8);
      uVar9 = *(undefined8 *)&(b->last).d.field_0x18;
      puVar3 = (undefined8 *)((long)&pCVar4[lVar5].last.d.data + 0x10);
      *puVar3 = *(undefined8 *)((long)&(b->last).d.data + 0x10);
      puVar3[1] = uVar9;
      pCVar4[lVar5].last.d.data.shared = pPVar8;
      *(undefined8 *)((long)&pCVar4[lVar5].last.d.data + 8) = uVar7;
      *(undefined8 *)((long)&(b->last).d.data + 0x10) = 0;
      (b->last).d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(b->last).d.data + 8) = 0;
      *(undefined8 *)&(b->last).d.field_0x18 = 2;
      pPVar8 = (b->next).d.data.shared;
      uVar7 = *(undefined8 *)((long)&(b->next).d.data + 8);
      uVar9 = *(undefined8 *)&(b->next).d.field_0x18;
      puVar3 = (undefined8 *)((long)&pCVar4[lVar5].next.d.data + 0x10);
      *puVar3 = *(undefined8 *)((long)&(b->next).d.data + 0x10);
      puVar3[1] = uVar9;
      pCVar4[lVar5].next.d.data.shared = pPVar8;
      *(undefined8 *)((long)&pCVar4[lVar5].next.d.data + 8) = uVar7;
      (b->next).d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(b->next).d.data + 8) = 0;
      *(undefined8 *)((long)&(b->next).d.data + 0x10) = 0;
      *(undefined8 *)&(b->next).d.field_0x18 = 2;
      pqVar1 = &(this->super_QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }